

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O1

void nbt_free(nbt_node *tree)

{
  if (tree == (nbt_node *)0x0) {
    return;
  }
  switch(tree->type) {
  case TAG_BYTE_ARRAY:
  case TAG_STRING:
  case TAG_INT_ARRAY:
  case TAG_LONG_ARRAY:
    free((tree->payload).tag_byte_array.data);
    break;
  case TAG_LIST:
  case TAG_COMPOUND:
    nbt_free_list((tree->payload).tag_list);
  }
  free(tree->name);
  free(tree);
  return;
}

Assistant:

void nbt_free(nbt_node* tree)
{
    if(tree == NULL) return;

    if(tree->type == TAG_LIST)
        nbt_free_list(tree->payload.tag_list);

    else if (tree->type == TAG_COMPOUND)
        nbt_free_list(tree->payload.tag_compound);

    else if(tree->type == TAG_BYTE_ARRAY)
        free(tree->payload.tag_byte_array.data);

    else if(tree->type == TAG_INT_ARRAY)
        free(tree->payload.tag_int_array.data);

    else if(tree->type == TAG_LONG_ARRAY)
        free(tree->payload.tag_long_array.data);

    else if(tree->type == TAG_STRING)
        free(tree->payload.tag_string);

    free(tree->name);
    free(tree);
}